

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::LocalResponse::LocalResponse(LocalResponse *this,Maybe<capnp::MessageSize> *sizeHint)

{
  uint firstSegmentWords;
  Maybe<capnp::MessageSize> local_30;
  Maybe<capnp::MessageSize> *local_18;
  Maybe<capnp::MessageSize> *sizeHint_local;
  LocalResponse *this_local;
  
  local_18 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  ResponseHook::ResponseHook(&this->super_ResponseHook);
  (this->super_ResponseHook)._vptr_ResponseHook = (_func_int **)&PTR__LocalResponse_00d8a1b0;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_30,sizeHint);
  firstSegmentWords = firstSegmentSize(&local_30);
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_30);
  return;
}

Assistant:

LocalResponse(kj::Maybe<MessageSize> sizeHint)
      : message(firstSegmentSize(sizeHint)) {}